

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::
expression_lhs<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>const&>
::operator<=(result *__return_storage_ptr__,
            expression_lhs<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>const&>
            *this,value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>
                  *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  int *piVar2;
  int *piVar3;
  size_type sVar4;
  char *pcVar5;
  bool bVar6;
  value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *in_R8;
  compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  string local_b8;
  value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  char *local_78;
  size_type local_70;
  char local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  bool local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = *(lest **)this;
  piVar2 = *(int **)this_00;
  if (piVar2 == (int *)0x0) {
    bVar6 = true;
  }
  else {
    piVar3 = (rhs->ptr).ptr;
    if (piVar3 == (int *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = *piVar2 <= *piVar3;
    }
  }
  local_d8.ptr = (pointer)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"<=","");
  local_98.ptr.ptr =
       (compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>)
       local_88;
  if (local_d8.ptr == (pointer)local_c8) {
    uStack_80 = uStack_c0;
  }
  else {
    local_98.ptr.ptr =
         (compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>)
         (compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>)
         local_d8.ptr;
  }
  local_90 = local_d0;
  local_d0 = 0;
  local_c8[0] = 0;
  local_d8.ptr = (pointer)local_c8;
  to_string<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>,nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>>
            (&local_b8,this_00,&local_98,(string *)rhs,in_R8);
  sVar4 = local_b8._M_string_length;
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar1) {
    uStack_60 = local_b8.field_2._8_4_;
    uStack_5c = local_b8.field_2._12_4_;
    local_b8._M_dataplus._M_p = local_68;
  }
  local_70 = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity._0_4_ =
       local_b8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  pcVar5 = local_b8._M_dataplus._M_p + sVar4;
  local_78 = local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  local_58 = bVar6;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,pcVar5);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_98.ptr.ptr !=
      (compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>)
      local_88) {
    operator_delete((void *)local_98.ptr.ptr);
  }
  if (local_d8.ptr != (pointer)local_c8) {
    operator_delete(local_d8.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }